

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_dict.cpp
# Opt level: O1

void duckdb_brotli::BrotliCleanupSharedEncoderDictionary
               (MemoryManager *m,SharedEncoderDictionary *dict)

{
  size_t sVar1;
  ulong uVar2;
  long lVar3;
  
  if ((dict->compound).num_prepared_instances_ != 0) {
    uVar2 = 0;
    do {
      DestroyPreparedDictionary(m,(dict->compound).prepared_instances_[uVar2]);
      uVar2 = uVar2 + 1;
    } while (uVar2 < (dict->compound).num_prepared_instances_);
  }
  sVar1 = (dict->contextual).num_instances_;
  if (sVar1 != 0) {
    if (sVar1 == 1) {
      BrotliDestroyEncoderDictionary(m,&(dict->contextual).instance_);
      return;
    }
    if ((dict->contextual).num_instances_ != 0) {
      lVar3 = 0;
      uVar2 = 0;
      do {
        BrotliDestroyEncoderDictionary
                  (m,(BrotliEncoderDictionary *)
                     ((long)&((dict->contextual).instances_)->words + lVar3));
        uVar2 = uVar2 + 1;
        lVar3 = lVar3 + 0xa8;
      } while (uVar2 < (dict->contextual).num_instances_);
    }
    BrotliFree(m,(dict->contextual).instances_);
    return;
  }
  return;
}

Assistant:

void duckdb_brotli::BrotliCleanupSharedEncoderDictionary(MemoryManager* m,
                                          SharedEncoderDictionary* dict) {
  size_t i;
  for (i = 0; i < dict->compound.num_prepared_instances_; i++) {
    DestroyPreparedDictionary(m,
        (PreparedDictionary*)dict->compound.prepared_instances_[i]);
  }
  if (dict->contextual.num_instances_ == 1) {
    BrotliDestroyEncoderDictionary(m, &dict->contextual.instance_);
  } else if (dict->contextual.num_instances_ > 1) {
    for (i = 0; i < dict->contextual.num_instances_; i++) {
      BrotliDestroyEncoderDictionary(m, &dict->contextual.instances_[i]);
    }
    BrotliFree(m, dict->contextual.instances_);
  }
}